

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O0

int x25519_derive_secret
              (ptls_iovec_t *secret,uint8_t *clientpriv,uint8_t *clientpub,uint8_t *serverpriv,
              uint8_t *serverpub)

{
  uint8_t *puVar1;
  uint8_t *local_58;
  uint8_t *serverpub_local;
  uint8_t *serverpriv_local;
  uint8_t *clientpub_local;
  uint8_t *clientpriv_local;
  ptls_iovec_t *secret_local;
  
  puVar1 = (uint8_t *)malloc(0x20);
  secret->base = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    secret_local._4_4_ = 0x201;
  }
  else {
    local_58 = clientpub;
    if (clientpriv != (uint8_t *)0x0) {
      local_58 = serverpub;
      serverpriv = clientpriv;
    }
    cf_curve25519_mul(secret->base,serverpriv,local_58);
    secret->len = 0x20;
    secret_local._4_4_ = 0;
  }
  return secret_local._4_4_;
}

Assistant:

static int x25519_derive_secret(ptls_iovec_t *secret, const uint8_t *clientpriv, const uint8_t *clientpub,
                                const uint8_t *serverpriv, const uint8_t *serverpub)
{
    if ((secret->base = malloc(X25519_KEY_SIZE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    cf_curve25519_mul(secret->base, clientpriv != NULL ? clientpriv : serverpriv, clientpriv != NULL ? serverpub : clientpub);
    secret->len = X25519_KEY_SIZE;
    return 0;
}